

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O3

void __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::~Signal
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this)

{
  ~Signal(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

virtual ~Signal() {}